

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_lpf_get_heap_layout(ma_lpf_config *pConfig,ma_lpf_heap_layout *pHeapLayout)

{
  uint uVar1;
  size_t sVar2;
  ma_result mVar3;
  uint uVar4;
  double __x;
  
  if (pHeapLayout == (ma_lpf_heap_layout *)0x0) {
    __assert_fail("pHeapLayout != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x83b5,
                  "ma_result ma_lpf_get_heap_layout(const ma_lpf_config *, ma_lpf_heap_layout *)");
  }
  pHeapLayout->sizeInBytes = 0;
  pHeapLayout->lpf1Offset = 0;
  pHeapLayout->lpf2Offset = 0;
  mVar3 = MA_INVALID_ARGS;
  if (((pConfig != (ma_lpf_config *)0x0) && (uVar1 = pConfig->channels, (ulong)uVar1 != 0)) &&
     (uVar4 = pConfig->order, uVar4 < 9)) {
    pHeapLayout->sizeInBytes = 0;
    pHeapLayout->lpf1Offset = 0;
    if ((uVar4 & 1) == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = ((ulong)uVar1 * 4 + 7 & 0xfffffffffffffff8) + 0x28;
      pHeapLayout->sizeInBytes = sVar2;
    }
    pHeapLayout->lpf2Offset = sVar2;
    if (1 < uVar4) {
      uVar4 = uVar4 >> 1;
      do {
        uVar1 = pConfig->channels;
        __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
        sin(__x);
        sin(1.5707963267948966 - __x);
        if ((ulong)uVar1 == 0) {
          return MA_INVALID_ARGS;
        }
        sVar2 = pHeapLayout->sizeInBytes + (ulong)uVar1 * 8 + 0x40;
        pHeapLayout->sizeInBytes = sVar2;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    pHeapLayout->sizeInBytes = sVar2 + 7 & 0xfffffffffffffff8;
    mVar3 = MA_SUCCESS;
  }
  return mVar3;
}

Assistant:

static ma_result ma_lpf_get_heap_layout(const ma_lpf_config* pConfig, ma_lpf_heap_layout* pHeapLayout)
{
    ma_result result;
    ma_uint32 lpf1Count;
    ma_uint32 lpf2Count;
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;

    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channels == 0) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    ma_lpf_calculate_sub_lpf_counts(pConfig->order, &lpf1Count, &lpf2Count);

    pHeapLayout->sizeInBytes = 0;

    /* LPF 1 */
    pHeapLayout->lpf1Offset = pHeapLayout->sizeInBytes;
    for (ilpf1 = 0; ilpf1 < lpf1Count; ilpf1 += 1) {
        size_t lpf1HeapSizeInBytes;
        ma_lpf1_config lpf1Config = ma_lpf1_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency);

        result = ma_lpf1_get_heap_size(&lpf1Config, &lpf1HeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += sizeof(ma_lpf1) + lpf1HeapSizeInBytes;
    }

    /* LPF 2*/
    pHeapLayout->lpf2Offset = pHeapLayout->sizeInBytes;
    for (ilpf2 = 0; ilpf2 < lpf2Count; ilpf2 += 1) {
        size_t lpf2HeapSizeInBytes;
        ma_lpf2_config lpf2Config = ma_lpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, 0.707107);   /* <-- The "q" parameter does not matter for the purpose of calculating the heap size. */

        result = ma_lpf2_get_heap_size(&lpf2Config, &lpf2HeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += sizeof(ma_lpf2) + lpf2HeapSizeInBytes;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}